

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall QAccessibleTable::childAt(QAccessibleTable *this)

{
  int in_stack_00000028;
  int in_stack_0000002c;
  QAccessibleTable *in_stack_00000030;
  
  childAt(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  return;
}

Assistant:

QAccessibleInterface *QAccessibleTable::childAt(int x, int y) const
{
    QPoint viewportOffset = view()->viewport()->mapTo(view(), QPoint(0,0));
    QPoint indexPosition = view()->mapFromGlobal(QPoint(x, y) - viewportOffset);
    // FIXME: if indexPosition < 0 in one coordinate, return header

    const QModelIndex index = view()->indexAt(indexPosition);
    if (index.isValid())
        return child(logicalIndex(index));
    return nullptr;
}